

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvelopeForm.cpp
# Opt level: O2

void __thiscall EnvelopeForm::setEnvelope(EnvelopeForm *this,uint8_t value)

{
  this->mEnvelope = value;
  this->mIgnoreChanges = true;
  QSpinBox::setValue((int)this + 0x78);
  QAbstractButton::setChecked((bool)((char)this + -0x60));
  QSpinBox::setValue((int)this + 0xf0);
  this->mIgnoreChanges = false;
  return;
}

Assistant:

void EnvelopeForm::setEnvelope(uint8_t value) {
    mEnvelope = value;
    mIgnoreChanges = true;
    mInitVolumeSpin.setValue(value >> 4);
    mIncreasingCheckbox.setChecked(!!(value & 0x8));
    mPeriodSpin.setValue(value & 0x7);
    mIgnoreChanges = false;
}